

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

bcf_hdr_t * bcf_hdr_subset(bcf_hdr_t *h0,int n,char **samples,int *imap)

{
  undefined4 uVar1;
  undefined4 uVar2;
  khint32_t *pkVar3;
  ulong uVar4;
  size_t sVar5;
  khint_t kVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  kh_str2int_t *h;
  char *p;
  bcf_hdr_t *hdr;
  char *pcVar10;
  ulong uVar11;
  size_t sVar12;
  byte bVar13;
  sbyte sVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  khint_t kVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  bool bVar22;
  int hlen;
  undefined1 local_68 [16];
  char *local_58;
  ulong local_50;
  bcf_hdr_t *local_48;
  int *local_40;
  ulong local_38;
  
  h = (kh_str2int_t *)calloc(1,0x28);
  p = bcf_hdr_fmt_text(h0,1,&hlen);
  local_68 = (undefined1  [16])0x0;
  local_58 = (char *)0x0;
  hdr = bcf_hdr_init("w");
  local_48 = h0;
  pcVar10 = bcf_hdr_get_version(h0);
  bcf_hdr_set_version(hdr,pcVar10);
  uVar11 = 0;
  uVar15 = 0;
  if (0 < n) {
    uVar15 = (ulong)(uint)n;
  }
  for (; uVar15 != uVar11; uVar11 = uVar11 + 1) {
    imap[uVar11] = -1;
  }
  if (local_48->n[2] < 1) {
    kputsn(p,hlen,(kstring_t *)local_68);
  }
  else {
    uVar16 = 8 - (n == 0);
    local_38 = uVar15;
    pcVar10 = strstr(p,"#CHROM\t");
    for (uVar19 = 0; (pcVar10 = strchr(pcVar10,9), pcVar10 != (char *)0x0 && (uVar19 < uVar16));
        uVar19 = uVar19 + 1) {
      pcVar10 = pcVar10 + 1;
    }
    if (uVar16 != uVar19) {
      free(hdr);
      return (bcf_hdr_t *)0x0;
    }
    kputsn(p,(int)pcVar10 - (int)p,(kstring_t *)local_68);
    local_40 = imap;
    for (uVar11 = 0; uVar11 != local_38; uVar11 = uVar11 + 1) {
      pcVar10 = samples[uVar11];
      kVar18 = h->n_buckets;
      if (kVar18 == 0) {
        uVar16 = 0;
LAB_0011763f:
        if (uVar16 != kVar18) {
          fprintf(_stderr,"[E::bcf_hdr_subset] Duplicate sample name \"%s\".\n");
          free(local_58);
          free(p);
          khash_str2int_destroy(h);
          bcf_hdr_destroy(hdr);
          return (bcf_hdr_t *)0x0;
        }
      }
      else {
        kVar6 = __ac_X31_hash_string(pcVar10);
        uVar19 = kVar6 & kVar18 - 1;
        pkVar3 = h->flags;
        iVar20 = 1;
        uVar16 = uVar19;
        do {
          uVar21 = pkVar3[uVar16 >> 4];
          bVar13 = (char)uVar16 * '\x02' & 0x1e;
          uVar7 = uVar21 >> bVar13;
          if (((uVar7 & 2) != 0) ||
             (((uVar7 & 1) == 0 && (iVar8 = strcmp(h->keys[uVar16],pcVar10), iVar8 == 0)))) {
            if ((uVar21 >> bVar13 & 3) != 0) {
              uVar16 = kVar18;
            }
            goto LAB_0011763f;
          }
          uVar16 = uVar16 + iVar20 & kVar18 - 1;
          iVar20 = iVar20 + 1;
        } while (uVar16 != uVar19);
      }
      iVar20 = bcf_hdr_id2int(local_48,2,pcVar10);
      local_40[uVar11] = iVar20;
      if (-1 < iVar20) {
        kputc(9,(kstring_t *)local_68);
        kputs(samples[uVar11],(kstring_t *)local_68);
        if (h != (kh_str2int_t *)0x0) {
          pcVar10 = samples[uVar11];
          if (h->n_occupied < h->upper_bound) {
LAB_001176d5:
            uVar15 = (ulong)h->n_buckets;
            uVar19 = h->n_buckets - 1;
            kVar18 = __ac_X31_hash_string(pcVar10);
            uVar16 = kVar18 & uVar19;
            pkVar3 = h->flags;
            if ((pkVar3[uVar16 >> 4] >> ((char)uVar16 * '\x02' & 0x1fU) & 2) == 0) {
              iVar20 = 1;
              uVar21 = uVar16;
              local_50 = uVar15;
              do {
                uVar7 = pkVar3[uVar21 >> 4];
                uVar17 = uVar21 * 2 & 0x1e;
                sVar14 = (sbyte)uVar17;
                uVar9 = uVar7 >> sVar14;
                if (((uVar9 & 2) != 0) ||
                   (((uVar9 & 1) == 0 && (iVar8 = strcmp(h->keys[uVar21],pcVar10), iVar8 == 0)))) {
                  bVar22 = (uVar7 >> sVar14 & 2) == 0;
                  uVar19 = (uint)uVar15;
                  goto LAB_001177be;
                }
                if ((uVar7 >> uVar17 & 1) != 0) {
                  uVar15 = (ulong)uVar21;
                }
                uVar21 = uVar21 + iVar20 & uVar19;
                iVar20 = iVar20 + 1;
              } while (uVar21 != uVar16);
              bVar22 = true;
              uVar19 = (uint)local_50;
              uVar21 = uVar16;
              if ((uint)uVar15 == uVar19) {
LAB_001177be:
                if (uVar19 == (uint)local_50) {
                  uVar19 = uVar21;
                }
                if (bVar22) {
                  uVar19 = uVar21;
                }
                uVar15 = (ulong)uVar19;
              }
            }
            else {
              uVar15 = (ulong)uVar16;
            }
            uVar4 = uVar15 >> 4;
            bVar13 = (char)uVar15 * '\x02' & 0x1e;
            if ((pkVar3[uVar4] >> bVar13 & 2) == 0) {
              if ((pkVar3[uVar4] >> bVar13 & 1) == 0) goto LAB_0011784c;
              h->keys[uVar15] = pcVar10;
              h->flags[uVar4] = h->flags[uVar4] & ~(3 << bVar13);
              h->size = h->size + 1;
            }
            else {
              h->keys[uVar15] = pcVar10;
              h->flags[uVar4] = h->flags[uVar4] & ~(3 << bVar13);
              uVar1 = h->size;
              uVar2 = h->n_occupied;
              h->size = uVar1 + 1;
              h->n_occupied = uVar2 + 1;
            }
          }
          else {
            uVar16 = h->n_buckets;
            if (h->size * 2 < uVar16) {
              kVar18 = uVar16 - 1;
            }
            else {
              kVar18 = uVar16 + 1;
            }
            iVar20 = kh_resize_str2int(h,kVar18);
            if (-1 < iVar20) goto LAB_001176d5;
            uVar15 = (ulong)h->n_buckets;
          }
          h->vals[uVar15] = h->size - 1;
        }
      }
LAB_0011784c:
    }
  }
  sVar5 = local_68._0_8_;
  do {
    sVar12 = sVar5;
    if (sVar12 == 0) break;
    sVar5 = sVar12 - 1;
  } while ((local_58[sVar12 - 1] == '\n') || (local_58[sVar12 - 1] == '\0'));
  local_68._0_8_ = sVar12;
  kputc(10,(kstring_t *)local_68);
  pcVar10 = local_58;
  bcf_hdr_parse(hdr,local_58);
  free(pcVar10);
  free(p);
  khash_str2int_destroy(h);
  return hdr;
}

Assistant:

bcf_hdr_t *bcf_hdr_subset(const bcf_hdr_t *h0, int n, char *const* samples, int *imap)
{
    int hlen;
    void *names_hash = khash_str2int_init();
    char *htxt = bcf_hdr_fmt_text(h0, 1, &hlen);
    kstring_t str;
    bcf_hdr_t *h;
    str.l = str.m = 0; str.s = 0;
    h = bcf_hdr_init("w");
    bcf_hdr_set_version(h,bcf_hdr_get_version(h0));
    int j;
    for (j=0; j<n; j++) imap[j] = -1;
    if ( bcf_hdr_nsamples(h0) > 0) {
        char *p;
        int i = 0, end = n? 8 : 7;
        while ((p = strstr(htxt, "#CHROM\t")) != 0)
            if (p > htxt && *(p-1) == '\n') break;
        while ((p = strchr(p, '\t')) != 0 && i < end) ++i, ++p;
        if (i != end) {
            free(h); free(str.s);
            return 0; // malformated header
        }
        kputsn(htxt, p - htxt, &str);
        for (i = 0; i < n; ++i) {
            if ( khash_str2int_has_key(names_hash,samples[i]) )
            {
                fprintf(stderr,"[E::bcf_hdr_subset] Duplicate sample name \"%s\".\n", samples[i]);
                free(str.s);
                free(htxt);
                khash_str2int_destroy(names_hash);
                bcf_hdr_destroy(h);
                return NULL;
            }
            imap[i] = bcf_hdr_id2int(h0, BCF_DT_SAMPLE, samples[i]);
            if (imap[i] < 0) continue;
            kputc('\t', &str);
            kputs(samples[i], &str);
            khash_str2int_inc(names_hash,samples[i]);
        }
    } else kputsn(htxt, hlen, &str);
    while (str.l && (!str.s[str.l-1] || str.s[str.l-1]=='\n') ) str.l--; // kill trailing zeros and newlines
    kputc('\n',&str);
    bcf_hdr_parse(h, str.s);
    free(str.s);
    free(htxt);
    khash_str2int_destroy(names_hash);
    return h;
}